

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

Names * __thiscall
cmGeneratorTarget::GetLibraryNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *vName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char *pcVar6;
  char *version;
  long *plVar7;
  size_type *psVar8;
  char *version_00;
  string prefix;
  string suffix;
  string local_c0;
  string local_a0;
  string *local_80;
  string local_78;
  cmGeneratorTarget *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->Base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Base).field_2
  ;
  (__return_storage_ptr__->Base)._M_string_length = 0;
  (__return_storage_ptr__->Base).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Output).field_2;
  (__return_storage_ptr__->Output)._M_string_length = 0;
  (__return_storage_ptr__->Output).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Real)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Real).field_2
  ;
  (__return_storage_ptr__->Real)._M_string_length = 0;
  (__return_storage_ptr__->Real).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ImportLibrary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ImportLibrary).field_2;
  (__return_storage_ptr__->ImportLibrary)._M_string_length = 0;
  (__return_storage_ptr__->ImportLibrary).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->PDB)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->PDB).field_2;
  (__return_storage_ptr__->PDB)._M_string_length = 0;
  (__return_storage_ptr__->PDB).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->SharedObject)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->SharedObject).field_2;
  (__return_storage_ptr__->SharedObject)._M_string_length = 0;
  (__return_storage_ptr__->SharedObject).field_2._M_local_buf[0] = '\0';
  local_80 = config;
  bVar2 = cmTarget::IsImported(this->Target);
  paVar1 = &local_c0.field_2;
  if (bVar2) {
    local_78._M_dataplus._M_p = (pointer)0x2b;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    local_c0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_78);
    local_c0.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
    builtin_strncpy(local_c0._M_dataplus._M_p,"GetLibraryNames called on imported target: ",0x2b);
    local_c0._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_c0._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)(psVar5->_M_dataplus)._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  local_c0._M_string_length = 7;
  local_c0.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = GetProperty(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_c0.field_2._8_2_ = 0x4e;
  local_c0._M_string_length = 9;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  version = GetProperty(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = HasSOName(this,local_80);
  if (bVar2) {
    this_00 = this->Makefile;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_78._M_dataplus._M_p = (pointer)0x22;
    local_c0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_78);
    local_c0.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
    builtin_strncpy(local_c0._M_dataplus._M_p,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",0x22);
    local_c0._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_c0._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
    bVar2 = cmMakefile::IsOn(this_00,&local_c0);
    bVar3 = true;
    if (!bVar2) {
      bVar3 = IsFrameworkOnApple(this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 != false) {
      version = (char *)0x0;
      pcVar6 = (char *)0x0;
    }
  }
  else {
    version = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  version_00 = pcVar6;
  if (version != (char *)0x0) {
    version_00 = version;
  }
  if (pcVar6 == (char *)0x0) {
    version_00 = version;
  }
  if (version_00 == (char *)0x0) {
    version = pcVar6;
  }
  if (pcVar6 != (char *)0x0) {
    version = pcVar6;
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity =
       local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,local_80,RuntimeBinaryArtifact,&local_c0,&__return_storage_ptr__->Base,
                      &local_78);
  std::operator+(&local_50,&local_c0,&__return_storage_ptr__->Base);
  local_58 = this;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
  psVar5 = &__return_storage_ptr__->Output;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_a0.field_2._M_allocated_capacity = *psVar8;
    local_a0.field_2._8_8_ = plVar7[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar8;
    local_a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)psVar5,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  this_01 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = IsFrameworkOnApple(this_01);
  vName = &__return_storage_ptr__->Real;
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)vName);
    bVar2 = cmMakefile::PlatformIsAppleEmbedded(this_01->Makefile);
    if (!bVar2) {
      std::__cxx11::string::append((char *)vName);
      GetFrameworkVersion_abi_cxx11_(&local_a0,this_01);
      std::__cxx11::string::_M_append((char *)vName,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)vName);
    }
    std::__cxx11::string::_M_append
              ((char *)vName,(ulong)(__return_storage_ptr__->Base)._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->SharedObject);
  }
  else {
    ComputeVersionedName
              (this_01,&__return_storage_ptr__->SharedObject,&local_c0,&__return_storage_ptr__->Base
               ,&local_78,psVar5,version_00);
    ComputeVersionedName
              (this_01,vName,&local_c0,&__return_storage_ptr__->Base,&local_78,psVar5,version);
  }
  TVar4 = cmTarget::GetType(this_01->Target);
  if ((TVar4 == SHARED_LIBRARY) ||
     (TVar4 = cmTarget::GetType(this_01->Target), TVar4 == MODULE_LIBRARY)) {
    GetFullNameInternal(&local_a0,this_01,local_80,ImportLibraryArtifact);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  GetPDBName(&local_a0,this_01,local_80);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetLibraryNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if (!this->HasSOName(config) ||
      this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
      this->IsFrameworkOnApple()) {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = nullptr;
    soversion = nullptr;
  }
  if (version && !soversion) {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
  }
  if (!version && soversion) {
    // Use the soversion as the library version.
    version = soversion;
  }

  // Get the components of the library name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The library name.
  targetNames.Output = prefix + targetNames.Base + suffix;

  if (this->IsFrameworkOnApple()) {
    targetNames.Real = prefix;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      targetNames.Real += "Versions/";
      targetNames.Real += this->GetFrameworkVersion();
      targetNames.Real += "/";
    }
    targetNames.Real += targetNames.Base;
    targetNames.SharedObject = targetNames.Real;
  } else {
    // The library's soname.
    this->ComputeVersionedName(targetNames.SharedObject, prefix,
                               targetNames.Base, suffix, targetNames.Output,
                               soversion);

    // The library's real name on disk.
    this->ComputeVersionedName(targetNames.Real, prefix, targetNames.Base,
                               suffix, targetNames.Output, version);
  }

  // The import library name.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames.ImportLibrary =
      this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  }

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}